

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O1

void readError(void)

{
  fprintf(_stderr,"%s: I/O error reading `%s\', possible reason follows.\n",progName,inFileName);
  perror(progName);
  fprintf(_stderr,"%s: warning: output file(s) may be incomplete.\n",progName);
  exit(1);
}

Assistant:

static void readError ( void )
{
   fprintf ( stderr,
             "%s: I/O error reading `%s', possible reason follows.\n",
            progName, inFileName );
   perror ( progName );
   fprintf ( stderr, "%s: warning: output file(s) may be incomplete.\n",
             progName );
   exit ( 1 );
}